

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O0

double mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(uint8_t *bytes)

{
  double dVar1;
  to_endian<8UL,_mvm::num::big_endian_tag,_mvm::num::little_endian_tag> local_19;
  array<unsigned_char,_8UL> local_18;
  array<unsigned_char,_8UL> bytes_arr;
  uint8_t *bytes_local;
  
  bytes_arr._M_elems = (_Type)bytes;
  local_18 = details::to_endian<8UL,_mvm::num::big_endian_tag,_mvm::num::little_endian_tag>::
             operator()(&local_19,bytes);
  dVar1 = parse_floating<double,8ul>(&local_18);
  return dVar1;
}

Assistant:

auto parse(uint8_t const *bytes) {
  auto bytes_arr = details::to_endian<N, Endian, little_endian_tag>()(bytes);

  if constexpr (std::is_floating_point_v<T>) {
    return parse_floating<T>(bytes_arr);
  } else if constexpr (std::is_integral_v<T> && std::is_unsigned_v<T>) {
    return parse_unsigned<T>(bytes_arr);
  } else if constexpr (std::is_integral_v<T> && std::is_signed_v<T>) {
    return parse_signed<T>(bytes_arr);
  }
}